

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImU32 text_col;
  ImRect bb;
  ImVec2 pos;
  ImVec2 total_size;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImDrawList *in_stack_ffffffffffffff38;
  ImVec2 IVar5;
  __va_list_tag *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  ImRect *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff60;
  ImVec2 *this;
  ImGuiID id;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImVec2 local_8c;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  float fVar6;
  float fVar7;
  ImVec2 local_68;
  ImRect local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  ImGuiWindow *local_18;
  
  local_18 = GetCurrentWindow();
  if ((local_18->SkipItems & 1U) == 0) {
    local_20 = GImGui;
    local_28 = &GImGui->Style;
    ImFormatStringToTempBufferV
              (in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_40 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (char *)in_stack_ffffffffffffff60,
                            SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0),
                            SUB84(in_stack_ffffffffffffff58,0));
    if (local_40.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_28->FramePadding).x;
      fVar3 = fVar3 + fVar3 + local_40.x;
    }
    this = &local_48;
    ImVec2::ImVec2(this,local_20->FontSize + fVar3,local_40.y);
    IVar5 = (local_18->DC).CursorPos;
    local_50.y = IVar5.y;
    local_50.x = IVar5.x;
    local_50.y = local_50.y + (local_18->DC).CurrLineTextBaseOffset;
    ItemSize(this,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    id = (ImGuiID)((ulong)this >> 0x20);
    local_68 = ::operator+((ImVec2 *)in_stack_ffffffffffffff38,(ImVec2 *)0x4e5112);
    ImRect::ImRect(&local_60,&local_50,&local_68);
    bVar1 = ItemAdd((ImRect *)CONCAT44(fVar3,in_stack_ffffffffffffff68),id,in_stack_ffffffffffffff58
                    ,(ImGuiItemFlags)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    if (bVar1) {
      fVar2 = (float)GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                 SUB84(in_stack_ffffffffffffff50,0));
      fVar3 = local_20->FontSize * 0.5;
      IVar5 = (ImVec2)&stack0xffffffffffffff84;
      ImVec2::ImVec2((ImVec2 *)IVar5,fVar3 + (local_28->FramePadding).x,fVar3);
      IVar4 = ::operator+((ImVec2 *)in_stack_ffffffffffffff38,(ImVec2 *)0x4e51c1);
      fVar6 = IVar4.x;
      fVar7 = IVar4.y;
      RenderBullet(in_stack_ffffffffffffff38,IVar5,0);
      fVar3 = (local_28->FramePadding).x;
      ImVec2::ImVec2(&local_8c,fVar3 + fVar3 + local_20->FontSize,0.0);
      IVar4 = ::operator+((ImVec2 *)in_stack_ffffffffffffff38,(ImVec2 *)0x4e5221);
      IVar5.y = fVar2;
      IVar5.x = fVar7;
      RenderText(IVar5,(char *)CONCAT44(fVar6,in_stack_ffffffffffffff88),
                 (char *)CONCAT44(in_stack_ffffffffffffff84,IVar4.y),IVar4.x._3_1_);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin, *text_end;
    ImFormatStringToTempBufferV(&text_begin, &text_end, fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const ImVec2 total_size = ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x * 2) : 0.0f), label_size.y);  // Empty text doesn't add padding
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(total_size, 0.0f);
    const ImRect bb(pos, pos + total_size);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize * 0.5f, g.FontSize * 0.5f), text_col);
    RenderText(bb.Min + ImVec2(g.FontSize + style.FramePadding.x * 2, 0.0f), text_begin, text_end, false);
}